

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O0

bool __thiscall
libwebm::Webm2Pes::ReadVideoFrame(Webm2Pes *this,Frame *mkvparser_frame,VideoFrame *frame)

{
  ulong length;
  bool bVar1;
  Buffer *pBVar2;
  pointer buf;
  long lVar3;
  size_t new_size;
  size_t mkv_len;
  VideoFrame *frame_local;
  Frame *mkvparser_frame_local;
  Webm2Pes *this_local;
  
  if ((mkvparser_frame->len < 1) || (frame == (VideoFrame *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    length = mkvparser_frame->len;
    pBVar2 = VideoFrame::buffer(frame);
    if ((length <= pBVar2->capacity) || (bVar1 = VideoFrame::Init(frame,length << 1), bVar1)) {
      pBVar2 = VideoFrame::buffer(frame);
      buf = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                      (&pBVar2->data);
      lVar3 = mkvparser::Block::Frame::Read
                        (mkvparser_frame,&(this->webm_reader_).super_IMkvReader,buf);
      if (lVar3 == 0) {
        this_local._7_1_ = VideoFrame::SetBufferLength(frame,length);
      }
      else {
        fprintf(_stderr,"Webm2Pes: Error reading VPx frame!\n");
        this_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Webm2Pes: Out of memory.\n");
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Webm2Pes::ReadVideoFrame(const mkvparser::Block::Frame& mkvparser_frame,
                              VideoFrame* frame) {
  if (mkvparser_frame.len < 1 || frame == nullptr)
    return false;

  const std::size_t mkv_len = static_cast<std::size_t>(mkvparser_frame.len);
  if (mkv_len > frame->buffer().capacity) {
    const std::size_t new_size = 2 * mkv_len;
    if (frame->Init(new_size) == false) {
      std::fprintf(stderr, "Webm2Pes: Out of memory.\n");
      return false;
    }
  }
  if (mkvparser_frame.Read(&webm_reader_, frame->buffer().data.get()) != 0) {
    std::fprintf(stderr, "Webm2Pes: Error reading VPx frame!\n");
    return false;
  }
  return frame->SetBufferLength(mkv_len);
}